

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

ESPSResult
swrenderer::R_SetPatchStyle(FRenderStyle style,fixed_t alpha,int translation,uint32_t color)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  undefined4 in_EAX;
  FRemapTable *pFVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  code *pcVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT44(style.AsDWORD,in_EAX);
  FRenderStyle::CheckFuzz((FRenderStyle *)((long)&uStack_28 + 4));
  if (uStack_28._4_1_ == '\b') {
    uStack_28 = CONCAT44(LegacyRenderStyles[9].AsDWORD,(undefined4)uStack_28);
    alpha = 0x5555;
    color = 0;
  }
  if ((uStack_28 & 0x100000000000000) == 0) {
    uVar9 = 0x10000;
    if ((uStack_28 & 0x200000000000000) == 0) {
      uVar8 = 0x10000;
      if (alpha < 0x10000) {
        uVar8 = alpha;
      }
      uVar9 = 0;
      if (0 < (int)uVar8) {
        uVar9 = uVar8;
      }
    }
  }
  else {
    uVar9 = (int)(transsouls.Value * 65536.0);
  }
  if ((((translation != -1) && (drawerargs::dc_translation = (BYTE *)0x0, translation != 0)) &&
      (pFVar6 = TranslationToTable(translation), pFVar6 != (FRemapTable *)0x0)) &&
     (pFVar6->Inactive == false)) {
    drawerargs::dc_translation = pFVar6->Remap;
  }
  (anonymous_namespace)::basecolormapsave = basecolormap;
  hcolfunc_pre = R_DrawColumnHoriz;
  cVar5 = uStack_28._4_1_;
  if (uStack_28._4_1_ == '\x04') {
    colfunc = (code *)fuzzcolfunc;
    return DoDraw0;
  }
  if (uStack_28._4_4_ == LegacyRenderStyles[8].AsDWORD) {
    if (uVar9 < 0x1000) {
      return DontDraw;
    }
    colfunc = R_DrawShadedColumn;
    hcolfunc_post1 = rt_shaded1col;
    hcolfunc_post4 = rt_shaded4cols;
    lVar7 = fixedcolormap;
    if (fixedcolormap == 0) {
      lVar7 = *basecolormap;
    }
    drawerargs::dc_color = (uint)*(byte *)(lVar7 + (ulong)(color >> 0x18));
    lVar7 = (long)(0x10 - ((int)uVar9 >> 0xc));
    basecolormap = &ShadeFakeColormap + lVar7 * 4;
    drawerargs::dc_colormap = (&ShadeFakeColormap)[lVar7 * 4];
    if (-1 < (long)fixedlightlev && fixedcolormap == 0) {
      drawerargs::dc_colormap = drawerargs::dc_colormap + fixedlightlev;
    }
    goto LAB_002d128d;
  }
  if (uStack_28._5_1_ == '\x03') {
    uVar8 = 0x10000 - uVar9;
  }
  else {
    uVar8 = uVar9;
    if ((uStack_28._5_1_ != '\x02') && (uVar8 = 0, uStack_28._5_1_ == '\x01')) {
      uVar8 = 0x10000;
    }
  }
  if (uStack_28._6_1_ == '\x03') {
    uVar9 = 0x10000 - uVar9;
  }
  else if ((uStack_28._6_1_ != '\x02') && (uVar9 = 0, uStack_28._6_1_ == '\x01')) {
    uVar9 = 0x10000;
  }
  iVar11 = (int)uVar8 >> 10;
  if ((uStack_28 & 0x800000000000000) != 0) {
    uVar14 = color >> 0x10 & 0xff;
    uVar15 = color >> 8 & 0xff;
    uVar10 = color & 0xff;
    drawerargs::dc_color =
         (uint)RGB32k.All
               [(ulong)(uVar10 >> 3) + (ulong)(color >> 6 & 0x3e0) + (ulong)(color >> 9 & 0x7c00)];
    uVar1 = uVar10 ^ 0xff;
    uVar3 = uVar14 ^ 0xff;
    uVar4 = uVar15 ^ 0xff;
    if ((uStack_28 & 0x1000000000000000) == 0) {
      uVar1 = uVar10;
      uVar3 = uVar14;
      uVar4 = uVar15;
    }
    iVar2 = (int)uVar8 >> 8;
    if (0xfe < (int)uVar8 >> 8) {
      iVar2 = 0xff;
    }
    iVar13 = 0;
    if (0 < iVar2) {
      iVar13 = iVar2;
    }
    drawerargs::dc_srccolor_bgra = uVar4 << 8 | uVar3 << 0x10 | iVar13 << 0x18 | uVar1;
    drawerargs::dc_srccolor =
         uVar4 * iVar11 >> 4 & 0xfeffbff |
         (uVar1 * iVar11 & 0xffbfe0) << 6 | (iVar11 * uVar3 & 0x3fe0) << 0x10;
    hcolfunc_pre = R_FillColumnHoriz;
    drawerargs::dc_colormap = identitycolormap;
  }
  if ((r_drawtrans.Value != true) ||
     (((((uStack_28 & 0x1000000000000000) == 0 && (uVar8 == 0x10000)) && (uVar9 == 0)) &&
      (cVar5 == '\x01')))) {
    if ((uStack_28 & 0x800000000000000) == 0) {
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_map1col;
        colfunc = basecolfunc;
        hcolfunc_post4 = rt_map4cols;
      }
      else {
        hcolfunc_post1 = rt_tlate1col;
        colfunc = transcolfunc;
        hcolfunc_post4 = rt_tlate4cols;
      }
    }
    else {
      hcolfunc_post1 = rt_copy1col;
      colfunc = R_FillColumn;
      hcolfunc_post4 = rt_copy4cols;
    }
    goto LAB_002d128d;
  }
  if ((uStack_28 & 0x1000000000000000) == 0) {
    if ((cVar5 != '\x01') || (0x10000 < (int)(uVar9 + uVar8))) {
      drawerargs::dc_srcblend = (DWORD (*) [256])Col2RGB8_LessPrecision[iVar11];
      goto LAB_002d10bc;
    }
    drawerargs::dc_srcblend = Col2RGB8 + iVar11;
    drawerargs::dc_destblend = Col2RGB8 + ((int)uVar9 >> 10);
  }
  else {
    drawerargs::dc_srcblend = Col2RGB8_Inverse + iVar11;
LAB_002d10bc:
    drawerargs::dc_destblend = (DWORD (*) [256])Col2RGB8_LessPrecision[(int)uVar9 >> 10];
  }
  drawerargs::dc_srcalpha = uVar8;
  drawerargs::dc_destalpha = uVar9;
  if (cVar5 == '\x03') {
    if (uVar8 == 0 && uVar9 == 0x10000) {
      return DontDraw;
    }
    if ((uStack_28 & 0x800000000000000) != 0) {
      hcolfunc_post4 = rt_subclamp4cols;
      hcolfunc_post1 = rt_subclamp1col;
      colfunc = R_FillRevSubClampColumn;
      goto LAB_002d128d;
    }
    colfunc = R_DrawRevSubClampTranslatedColumn;
    if (drawerargs::dc_translation == (BYTE *)0x0) {
      colfunc = R_DrawRevSubClampColumn;
    }
    hcolfunc_post1 = rt_tlaterevsubclamp1col;
    if (drawerargs::dc_translation == (BYTE *)0x0) {
      hcolfunc_post1 = rt_revsubclamp1col;
    }
    pcVar12 = rt_revsubclamp4cols;
    hcolfunc_post4 = rt_tlaterevsubclamp4cols;
  }
  else if (cVar5 == '\x02') {
    if ((uStack_28 & 0x800000000000000) != 0) {
      hcolfunc_post4 = rt_subclamp4cols;
      hcolfunc_post1 = rt_subclamp1col;
      colfunc = R_FillSubClampColumn;
      goto LAB_002d128d;
    }
    colfunc = R_DrawSubClampTranslatedColumn;
    if (drawerargs::dc_translation == (BYTE *)0x0) {
      colfunc = R_DrawSubClampColumn;
    }
    hcolfunc_post1 = rt_tlatesubclamp1col;
    if (drawerargs::dc_translation == (BYTE *)0x0) {
      hcolfunc_post1 = rt_subclamp1col;
    }
    pcVar12 = rt_subclamp4cols;
    hcolfunc_post4 = rt_tlatesubclamp4cols;
  }
  else {
    if (cVar5 != '\x01') {
      return DontDraw;
    }
    if (uVar9 == 0x10000 && uVar8 == 0) {
      return DontDraw;
    }
    if ((int)(uVar9 + uVar8) < 0x10001) {
      if ((uStack_28 & 0x800000000000000) != 0) {
        hcolfunc_post4 = rt_add4cols;
        hcolfunc_post1 = rt_add1col;
        colfunc = R_FillAddColumn;
        goto LAB_002d128d;
      }
      colfunc = R_DrawTlatedAddColumn;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        colfunc = R_DrawAddColumn;
      }
      hcolfunc_post1 = rt_tlateadd1col;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_add1col;
      }
      pcVar12 = rt_add4cols;
      hcolfunc_post4 = rt_tlateadd4cols;
    }
    else {
      if ((uStack_28 & 0x800000000000000) != 0) {
        hcolfunc_post4 = rt_addclamp4cols;
        hcolfunc_post1 = rt_addclamp1col;
        colfunc = R_FillAddClampColumn;
        goto LAB_002d128d;
      }
      colfunc = R_DrawAddClampTranslatedColumn;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        colfunc = R_DrawAddClampColumn;
      }
      hcolfunc_post1 = rt_tlateaddclamp1col;
      if (drawerargs::dc_translation == (BYTE *)0x0) {
        hcolfunc_post1 = rt_addclamp1col;
      }
      pcVar12 = rt_addclamp4cols;
      hcolfunc_post4 = rt_tlateaddclamp4cols;
    }
  }
  if (drawerargs::dc_translation == (BYTE *)0x0) {
    hcolfunc_post4 = pcVar12;
  }
LAB_002d128d:
  return DoDraw1 - (r_columnmethod.Value == 0);
}

Assistant:

ESPSResult R_SetPatchStyle(FRenderStyle style, fixed_t alpha, int translation, uint32_t color)
	{
		using namespace drawerargs;

		fixed_t fglevel, bglevel;

		style.CheckFuzz();

		if (style.BlendOp == STYLEOP_Shadow)
		{
			style = LegacyRenderStyles[STYLE_TranslucentStencil];
			alpha = TRANSLUC33;
			color = 0;
		}

		if (style.Flags & STYLEF_TransSoulsAlpha)
		{
			alpha = fixed_t(transsouls * OPAQUE);
		}
		else if (style.Flags & STYLEF_Alpha1)
		{
			alpha = FRACUNIT;
		}
		else
		{
			alpha = clamp<fixed_t>(alpha, 0, OPAQUE);
		}

		if (translation != -1)
		{
			dc_translation = NULL;
			if (translation != 0)
			{
				FRemapTable *table = TranslationToTable(translation);
				if (table != NULL && !table->Inactive)
				{
					dc_translation = table->Remap;
				}
			}
		}
		basecolormapsave = basecolormap;
		hcolfunc_pre = R_DrawColumnHoriz;

		// Check for special modes
		if (style.BlendOp == STYLEOP_Fuzz)
		{
			colfunc = fuzzcolfunc;
			return DoDraw0;
		}
		else if (style == LegacyRenderStyles[STYLE_Shaded])
		{
			// Shaded drawer only gets 16 levels of alpha because it saves memory.
			if ((alpha >>= 12) == 0)
				return DontDraw;
			colfunc = R_DrawShadedColumn;
			hcolfunc_post1 = rt_shaded1col;
			hcolfunc_post4 = rt_shaded4cols;
			dc_color = fixedcolormap ? fixedcolormap[APART(color)] : basecolormap->Maps[APART(color)];
			dc_colormap = (basecolormap = &ShadeFakeColormap[16 - alpha])->Maps;
			if (fixedlightlev >= 0 && fixedcolormap == NULL)
			{
				dc_colormap += fixedlightlev;
			}
			return r_columnmethod ? DoDraw1 : DoDraw0;
		}

		fglevel = GetAlpha(style.SrcAlpha, alpha);
		bglevel = GetAlpha(style.DestAlpha, alpha);

		if (style.Flags & STYLEF_ColorIsFixed)
		{
			uint32_t x = fglevel >> 10;
			uint32_t r = RPART(color);
			uint32_t g = GPART(color);
			uint32_t b = BPART(color);
			// dc_color is used by the rt_* routines. It is indexed into dc_srcblend.
			dc_color = RGB32k.RGB[r >> 3][g >> 3][b >> 3];
			if (style.Flags & STYLEF_InvertSource)
			{
				r = 255 - r;
				g = 255 - g;
				b = 255 - b;
			}
			uint32_t alpha = clamp(fglevel >> (FRACBITS - 8), 0, 255);
			dc_srccolor_bgra = (alpha << 24) | (r << 16) | (g << 8) | b;
			// dc_srccolor is used by the R_Fill* routines. It is premultiplied
			// with the alpha.
			dc_srccolor = ((((r*x) >> 4) << 20) | ((g*x) >> 4) | ((((b)*x) >> 4) << 10)) & 0x3feffbff;
			hcolfunc_pre = R_FillColumnHoriz;
			R_SetColorMapLight(identitycolormap.Maps, 0, 0);
		}

		if (!R_SetBlendFunc(style.BlendOp, fglevel, bglevel, style.Flags))
		{
			return DontDraw;
		}
		return r_columnmethod ? DoDraw1 : DoDraw0;
	}